

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void __thiscall
chaiscript::exception::name_conflict_error::name_conflict_error
          (name_conflict_error *this,string *t_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"Name already exists in current context ",t_name);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__name_conflict_error_00478990;
  std::__cxx11::string::string((string *)&this->m_name,t_name);
  return;
}

Assistant:

explicit name_conflict_error(const std::string &t_name) noexcept
          : std::runtime_error("Name already exists in current context " + t_name)
          , m_name(t_name) {
      }